

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nhdp_interfaces.c
# Opt level: O3

void nhdp_interface_remove(nhdp_interface *interf)

{
  list_entity *plVar1;
  list_entity *plVar2;
  list_entity *plVar3;
  
  if (((&log_global_mask)[LOG_NHDP] & 2) != 0) {
    oonf_log(2,(ulong)LOG_NHDP,"src/nhdp/nhdp/nhdp_interfaces.c",0x118,0,0,
             "Remove interface to NHDP_interface tree: %s (refcount was %d)",(interf->_node).key,
             interf->_refcount);
  }
  if (1 < interf->_refcount) {
    interf->_refcount = interf->_refcount + -1;
    return;
  }
  oonf_class_event(&_interface_info,interf,OONF_OBJECT_REMOVED);
  netaddr_acl_remove(&interf->ifaddr_filter);
  oonf_timer_stop(&interf->_hello_timer);
  plVar3 = (interf->_if_addresses).list_head.next;
  plVar2 = plVar3->prev;
  while (plVar2 != (interf->_if_addresses).list_head.prev) {
    plVar1 = plVar3->next;
    _remove_addr((nhdp_interface_addr *)&plVar3[-9].prev);
    plVar3 = plVar1;
    plVar2 = plVar1->prev;
  }
  plVar3 = (interf->_links).next;
  plVar2 = plVar3->prev;
  while (plVar2 != (interf->_links).prev) {
    plVar1 = plVar3->next;
    nhdp_db_link_set_unsymmetric((nhdp_link *)&plVar3[-0x1f].prev);
    plVar3 = plVar1;
    plVar2 = plVar1->prev;
  }
  avl_remove(&_interface_tree,&interf->_node);
  os_interface_linux_remove(&interf->os_if_listener);
  oonf_rfc5444_remove_interface((interf->rfc5444_if).interface,&interf->rfc5444_if);
  oonf_class_free(&_interface_info,interf);
  return;
}

Assistant:

void
nhdp_interface_remove(struct nhdp_interface *interf) {
  struct nhdp_interface_addr *addr, *a_it;
  struct nhdp_link *lnk, *l_it;

  OONF_INFO(LOG_NHDP, "Remove interface to NHDP_interface tree: %s (refcount was %d)", nhdp_interface_get_name(interf),
    interf->_refcount);

  if (interf->_refcount > 1) {
    /* there are still users left */
    interf->_refcount--;
    return;
  }

  /* trigger event */
  oonf_class_event(&_interface_info, interf, OONF_OBJECT_REMOVED);

  /* free filter */
  netaddr_acl_remove(&interf->ifaddr_filter);

  /* stop Hellos */
  oonf_timer_stop(&interf->_hello_timer);

  avl_for_each_element_safe(&interf->_if_addresses, addr, _if_node, a_it) {
    _remove_addr(addr);
  }

  list_for_each_element_safe(&interf->_links, lnk, _if_node, l_it) {
    nhdp_db_link_set_unsymmetric(lnk);
  }

  /* remove first from tree because we use the interface name as a key */
  avl_remove(&_interface_tree, &interf->_node);

  /* now clean up the rest */
  os_interface_remove(&interf->os_if_listener);
  oonf_rfc5444_remove_interface(interf->rfc5444_if.interface, &interf->rfc5444_if);
  oonf_class_free(&_interface_info, interf);
}